

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav *pWav,ma_uint64 framesToWrite,void *pData)

{
  ushort uVar1;
  ulong uVar2;
  ma_uint32 mVar3;
  uint uVar4;
  ma_uint64 iSample;
  ma_uint64 mVar5;
  size_t sVar6;
  ma_uint64 iSample_2;
  long lVar7;
  ulong uVar8;
  ulong __n;
  ma_uint8 temp [4096];
  undefined1 local_1038 [4104];
  
  if (pData == (void *)0x0 || (framesToWrite == 0 || pWav == (ma_dr_wav *)0x0)) {
    uVar8 = 0;
  }
  else {
    uVar1 = pWav->channels;
    mVar3 = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    uVar8 = 0;
    uVar2 = (ulong)mVar3 / (ulong)uVar1;
    if (uVar1 <= mVar3) {
      lVar7 = 0;
      uVar4 = (int)uVar2 - 2;
      for (uVar8 = (ulong)pWav->bitsPerSample * uVar1 * framesToWrite >> 3; uVar8 != 0;
          uVar8 = uVar8 - sVar6) {
        __n = (0x1000 / uVar2) * uVar2;
        if (uVar8 < __n) {
          __n = uVar8;
        }
        memcpy(local_1038,pData,__n);
        if (uVar4 < 7) {
          mVar5 = (*(code *)(&DAT_00175a50 + *(int *)(&DAT_00175a50 + (ulong)uVar4 * 4)))();
          return mVar5;
        }
        sVar6 = ma_dr_wav_write_raw(pWav,__n,local_1038);
        if (sVar6 == 0) break;
        lVar7 = lVar7 + sVar6;
        pData = (void *)((long)pData + sVar6);
      }
      uVar8 = ((ulong)(lVar7 << 3) / (ulong)pWav->bitsPerSample) / (ulong)pWav->channels;
    }
  }
  return uVar8;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_write_pcm_frames_be(ma_dr_wav* pWav, ma_uint64 framesToWrite, const void* pData)
{
    ma_uint64 bytesToWrite;
    ma_uint64 bytesWritten;
    ma_uint32 bytesPerSample;
    const ma_uint8* pRunningData;
    if (pWav == NULL || framesToWrite == 0 || pData == NULL) {
        return 0;
    }
    bytesToWrite = ((framesToWrite * pWav->channels * pWav->bitsPerSample) / 8);
    if (bytesToWrite > MA_SIZE_MAX) {
        return 0;
    }
    bytesWritten = 0;
    pRunningData = (const ma_uint8*)pData;
    bytesPerSample = ma_dr_wav_get_bytes_per_pcm_frame(pWav) / pWav->channels;
    if (bytesPerSample == 0) {
        return 0;
    }
    while (bytesToWrite > 0) {
        ma_uint8 temp[4096];
        ma_uint32 sampleCount;
        size_t bytesJustWritten;
        ma_uint64 bytesToWriteThisIteration;
        bytesToWriteThisIteration = bytesToWrite;
        MA_DR_WAV_ASSERT(bytesToWriteThisIteration <= MA_SIZE_MAX);
        sampleCount = sizeof(temp)/bytesPerSample;
        if (bytesToWriteThisIteration > ((ma_uint64)sampleCount)*bytesPerSample) {
            bytesToWriteThisIteration = ((ma_uint64)sampleCount)*bytesPerSample;
        }
        MA_DR_WAV_COPY_MEMORY(temp, pRunningData, (size_t)bytesToWriteThisIteration);
        ma_dr_wav__bswap_samples(temp, sampleCount, bytesPerSample);
        bytesJustWritten = ma_dr_wav_write_raw(pWav, (size_t)bytesToWriteThisIteration, temp);
        if (bytesJustWritten == 0) {
            break;
        }
        bytesToWrite -= bytesJustWritten;
        bytesWritten += bytesJustWritten;
        pRunningData += bytesJustWritten;
    }
    return (bytesWritten * 8) / pWav->bitsPerSample / pWav->channels;
}